

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

SparseTextureProperties *
Diligent::GetStandardSparseTextureProperties
          (SparseTextureProperties *__return_storage_ptr__,TextureDesc *TexDesc)

{
  RESOURCE_DIMENSION RVar1;
  byte bVar2;
  uint uVar3;
  TextureFormatAttribs *pTVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  char (*Args_1) [54];
  Uint64 UVar8;
  Uint64 UVar9;
  SparseTextureProperties *pSVar10;
  uint uVar11;
  Uint64 UVar12;
  Uint32 UVar13;
  Uint32 UVar14;
  string msg;
  undefined1 local_88 [40];
  Uint64 local_60;
  SparseTextureProperties *local_58;
  int local_4c;
  Uint32 local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  pTVar4 = GetTextureFormatAttribs(TexDesc->Format);
  Args_1 = (char (*) [54])(ulong)pTVar4->NumComponents;
  uVar11 = 1;
  if (pTVar4->ComponentType != COMPONENT_TYPE_COMPRESSED) {
    uVar11 = (uint)pTVar4->NumComponents;
  }
  uVar11 = uVar11 * pTVar4->ComponentSize;
  uVar3 = uVar11 - 1;
  if ((uVar11 ^ uVar3) <= uVar3) {
    FormatString<char[26],char[24]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(TexelSize)",(char (*) [24])Args_1);
    Args_1 = (char (*) [54])0xb34;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb34);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  if (0xf < uVar3) {
    FormatString<char[26],char[34]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexelSize >= 1 && TexelSize <= 16",(char (*) [34])Args_1);
    Args_1 = (char (*) [54])0xb35;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb35);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  if (4 < (byte)(TexDesc->Type - RESOURCE_DIM_TEX_2D)) {
    FormatString<char[26],char[33]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"TexDesc.Is2D() || TexDesc.Is3D()",(char (*) [33])Args_1);
    Args_1 = (char (*) [54])0xb36;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb36);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  if (TexDesc->MipLevels == 0) {
    FormatString<char[46]>
              ((string *)local_88,(char (*) [46])"Number of mipmap calculation is not supported");
    Args_1 = (char (*) [54])0xb37;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb37);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  if ((TexDesc->SampleCount != 1) && (TexDesc->MipLevels != 1)) {
    FormatString<char[44]>
              ((string *)local_88,(char (*) [44])"Multisampled textures must have 1 mip level");
    Args_1 = (char (*) [54])0xb38;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb38);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  __return_storage_ptr__->MipTailStride = 0;
  __return_storage_ptr__->MipTailSize = 0;
  __return_storage_ptr__->AddressSpaceSize = 0;
  __return_storage_ptr__->MipTailOffset = 0;
  __return_storage_ptr__->FirstMipInTail = 0xffffffff;
  __return_storage_ptr__->TileSize[0] = 0;
  __return_storage_ptr__->TileSize[1] = 0;
  *(undefined8 *)(__return_storage_ptr__->TileSize + 2) = 0;
  __return_storage_ptr__->Flags = SPARSE_TEXTURE_FLAG_NONE;
  local_58 = __return_storage_ptr__;
  if (TexDesc->Type == RESOURCE_DIM_TEX_3D) {
    if (pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      FormatString<char[58]>
                ((string *)local_88,
                 (char (*) [58])"Compressed sparse 3D textures are currently not supported");
      DebugAssertionFailed
                ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb3e);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
      }
    }
    local_58->TileSize[0] = 0x40;
    local_58->TileSize[1] = 0x20;
    local_58->TileSize[2] = 0x20;
    if (1 < uVar11) {
      uVar3 = 0;
      bVar6 = 1;
      do {
        __return_storage_ptr__->TileSize[*(long *)(&DAT_00922e90 + (ulong)(uVar3 % 3) * 8)] =
             __return_storage_ptr__->TileSize[*(long *)(&DAT_00922e90 + (ulong)(uVar3 % 3) * 8)] >>
             1;
        bVar2 = bVar6 & 0x1f;
        uVar3 = uVar3 + 1;
        bVar6 = bVar6 + 1;
      } while ((uint)(1 << bVar2) < uVar11);
    }
  }
  else if (TexDesc->SampleCount < 2) {
    __return_storage_ptr__->TileSize[0] = 0x100;
    __return_storage_ptr__->TileSize[1] = 0x100;
    __return_storage_ptr__->TileSize[2] = 1;
    if (pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      bVar6 = pTVar4->ComponentSize;
      uVar3 = (uint)pTVar4->BlockHeight * (uint)pTVar4->BlockWidth;
      if (bVar6 < uVar3) {
        uVar7 = 0;
        do {
          __return_storage_ptr__->TileSize[uVar7 & 1] =
               __return_storage_ptr__->TileSize[uVar7 & 1] << 1;
          uVar7 = uVar7 + 1;
        } while ((int)((uint)bVar6 << ((byte)uVar7 & 0x1f)) < (int)uVar3);
      }
    }
    else if (1 < uVar11) {
      uVar3 = 0;
      do {
        __return_storage_ptr__->TileSize[*(long *)(&DAT_00812c90 + (ulong)(uVar3 & 1) * 8)] =
             __return_storage_ptr__->TileSize[*(long *)(&DAT_00812c90 + (ulong)(uVar3 & 1) * 8)] >>
             1;
        uVar3 = uVar3 + 1;
      } while ((uint)(1 << ((byte)uVar3 & 0x1f)) < uVar11);
    }
  }
  else {
    if (pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      FormatString<char[26],char[54]>
                ((string *)local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED",Args_1);
      DebugAssertionFailed
                ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb53);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
      }
    }
    uVar3 = TexDesc->SampleCount - 1;
    if ((TexDesc->SampleCount ^ uVar3) <= uVar3) {
      FormatString<char[26],char[34]>
                ((string *)local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"IsPowerOfTwo(TexDesc.SampleCount)",(char (*) [34])(ulong)uVar3);
      DebugAssertionFailed
                ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0xb5c);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
      }
    }
    uVar3 = TexDesc->SampleCount;
    UVar14 = 0x100;
    if (3 < uVar3) {
      UVar14 = (uint)(uVar3 < 0x10) * 0x40 + 0x40;
    }
    local_58->TileSize[0] = 0x80 >> (7 < uVar3);
    local_58->TileSize[1] = UVar14;
    local_58->TileSize[2] = 1;
    if (1 < uVar11) {
      uVar3 = 0;
      do {
        __return_storage_ptr__->TileSize[*(long *)(&DAT_00812c90 + (ulong)(uVar3 & 1) * 8)] =
             __return_storage_ptr__->TileSize[*(long *)(&DAT_00812c90 + (ulong)(uVar3 & 1) * 8)] >>
             1;
        uVar3 = uVar3 + 1;
      } while ((uint)(1 << ((byte)uVar3 & 0x1f)) < uVar11);
    }
  }
  pSVar10 = local_58;
  uVar3 = local_58->TileSize[0];
  local_44 = local_58->TileSize[1];
  local_48 = local_58->TileSize[2];
  uVar11 = (uVar3 / pTVar4->BlockWidth) * uVar11;
  if ((local_44 / pTVar4->BlockHeight) * local_48 * uVar11 * TexDesc->SampleCount != 0x10000) {
    FormatString<char[26],char[32]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BytesPerTile == SparseBlockSize",(char (*) [32])(ulong)uVar11);
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"GetStandardSparseTextureProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xb88);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    }
  }
  pSVar10->FirstMipInTail = 0xffffffff;
  UVar14 = 0;
  if (TexDesc->MipLevels == 0) {
    UVar13 = 0xffffffff;
    UVar12 = 0;
    uVar11 = 0;
  }
  else {
    local_4c = uVar3 - 1;
    local_38 = (ulong)pSVar10->TileSize[1];
    local_40 = (ulong)pSVar10->TileSize[2];
    UVar8 = pSVar10->MipTailOffset;
    UVar9 = pSVar10->MipTailSize;
    UVar13 = 0xffffffff;
    UVar12 = 0;
    do {
      GetMipLevelProperties((MipLevelProperties *)local_88,TexDesc,UVar14);
      if (((uint)local_88._12_4_ < local_44 || (uint)local_88._8_4_ < uVar3) ||
          (uint)local_88._16_4_ < local_48) {
        if (UVar13 == 0xffffffff) {
          UVar13 = UVar14;
          UVar8 = UVar12;
        }
        UVar9 = UVar9 + local_60;
      }
      else {
        UVar12 = UVar12 + ((ulong)((local_88._16_4_ + (int)local_40) - 1) / (local_40 & 0xffffffff))
                          * ((ulong)(uint)(local_88._8_4_ + local_4c) / (ulong)uVar3) *
                            ((ulong)((local_88._12_4_ + (int)local_38) - 1) /
                            (local_38 & 0xffffffff)) * 0x10000;
      }
      UVar14 = UVar14 + 1;
      uVar11 = TexDesc->MipLevels;
    } while (UVar14 < uVar11);
    local_58->MipTailOffset = UVar8;
    local_58->MipTailSize = UVar9;
    pSVar10 = local_58;
  }
  pSVar10->FirstMipInTail = UVar13;
  if (uVar11 < UVar13) {
    UVar13 = TexDesc->MipLevels;
  }
  pSVar10->FirstMipInTail = UVar13;
  uVar5 = pSVar10->MipTailSize + 0xffff & 0xffffffffffff0000;
  pSVar10->MipTailSize = uVar5;
  UVar12 = uVar5 + UVar12;
  RVar1 = TexDesc->Type;
  if ((8 < RVar1) || (UVar8 = UVar12, (0x1a8U >> (RVar1 & 0x1f) & 1) == 0)) {
    UVar8 = 0;
  }
  pSVar10->MipTailStride = UVar8;
  uVar5 = (ulong)(TexDesc->field_3).ArraySize;
  if ((0x1a8U >> (RVar1 & 0x1f) & 1) == 0) {
    uVar5 = 1;
  }
  if (RESOURCE_DIM_TEX_CUBE_ARRAY < RVar1) {
    uVar5 = 1;
  }
  pSVar10->AddressSpaceSize = uVar5 * UVar12;
  pSVar10->BlockSize = 0x10000;
  pSVar10->Flags = SPARSE_TEXTURE_FLAG_NONE;
  return pSVar10;
}

Assistant:

SparseTextureProperties GetStandardSparseTextureProperties(const TextureDesc& TexDesc)
{
    constexpr Uint32            SparseBlockSize = 64 << 10;
    const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
    const Uint32                TexelSize       = FmtAttribs.GetElementSize();
    VERIFY_EXPR(IsPowerOfTwo(TexelSize));
    VERIFY_EXPR(TexelSize >= 1 && TexelSize <= 16);
    VERIFY_EXPR(TexDesc.Is2D() || TexDesc.Is3D());
    VERIFY(TexDesc.MipLevels > 0, "Number of mipmap calculation is not supported");
    VERIFY(TexDesc.SampleCount == 1 || TexDesc.MipLevels == 1, "Multisampled textures must have 1 mip level");

    SparseTextureProperties Props;

    if (TexDesc.Is3D())
    {
        DEV_CHECK_ERR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED, "Compressed sparse 3D textures are currently not supported");

        //  | Texel size  |    Tile shape   |
        //  |-------------|-----------------|
        //  |     8-Bit   |   64 x 32 x 32  |
        //  |    16-Bit   |   32 x 32 x 32  |
        //  |    32-Bit   |   32 x 32 x 16  |
        //  |    64-Bit   |   32 x 16 x 16  |
        //  |   128-Bit   |   16 x 16 x 16  |
        Props.TileSize[0] = 64;
        Props.TileSize[1] = 32;
        Props.TileSize[2] = 32;

        constexpr size_t Remap[] = {0, 2, 1};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i % 3]] /= 2;
        }
    }
    else if (TexDesc.SampleCount > 1)
    {
        VERIFY_EXPR(FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED);

        //  | Texel size  |   Tile shape 2x  |   Tile shape 4x  |   Tile shape 8x  |   Tile shape 16x  |
        //  |-------------|------------------|------------------|------------------|-------------------|
        //  |     8-Bit   |   128 x 256 x 1  |   128 x 128 x 1  |   64 x 128 x 1   |    64 x 64 x 1    |
        //  |    16-Bit   |   128 x 128 x 1  |   128 x  64 x 1  |   64 x  64 x 1   |    64 x 32 x 1    |
        //  |    32-Bit   |    64 x 128 x 1  |    64 x  64 x 1  |   32 x  64 x 1   |    32 x 32 x 1    |
        //  |    64-Bit   |    64 x  64 x 1  |    64 x  32 x 1  |   32 x  32 x 1   |    32 x 16 x 1    |
        //  |   128-Bit   |    32 x  64 x 1  |    32 x  32 x 1  |   16 x  32 x 1   |    16 x 16 x 1    |
        VERIFY_EXPR(IsPowerOfTwo(TexDesc.SampleCount));
        Props.TileSize[0] = 128 >> (TexDesc.SampleCount >= 8 ? 1 : 0);
        Props.TileSize[1] = 256 >> (TexDesc.SampleCount >= 4 ? (TexDesc.SampleCount >= 16 ? 2 : 1) : 0);
        Props.TileSize[2] = 1;

        constexpr size_t Remap[] = {1, 0};
        for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
        {
            Props.TileSize[Remap[i & 1]] /= 2;
        }
    }
    else
    {
        Props.TileSize[0] = 256;
        Props.TileSize[1] = 256;
        Props.TileSize[2] = 1;
        if (FmtAttribs.ComponentType != COMPONENT_TYPE_COMPRESSED)
        {
            //  | Texel size  |    Tile shape   |
            //  |-------------|-----------------|
            //  |     8-Bit   |  256 x 256 x 1  |
            //  |    16-Bit   |  256 x 128 x 1  |
            //  |    32-Bit   |  128 x 128 x 1  |
            //  |    64-Bit   |  128 x  64 x 1  |
            //  |   128-Bit   |   64 x  64 x 1  |
            constexpr size_t Remap[] = {1, 0};
            for (Uint32 i = 0; (1u << i) < TexelSize; ++i)
            {
                Props.TileSize[Remap[i & 1]] /= 2;
            }
        }
        else
        {
            for (Uint32 i = 0; (FmtAttribs.ComponentSize << i) < (FmtAttribs.BlockWidth * FmtAttribs.BlockHeight); ++i)
            {
                Props.TileSize[i & 1] *= 2;
            }
        }
    }

    const Uint32 BytesPerTile =
        (Props.TileSize[0] / FmtAttribs.BlockWidth) *
        (Props.TileSize[1] / FmtAttribs.BlockHeight) *
        Props.TileSize[2] * TexDesc.SampleCount * TexelSize;
    VERIFY_EXPR(BytesPerTile == SparseBlockSize);

    Uint64 SliceSize     = 0;
    Props.FirstMipInTail = ~0u;
    for (Uint32 Mip = 0; Mip < TexDesc.MipLevels; ++Mip)
    {
        const MipLevelProperties MipProps  = GetMipLevelProperties(TexDesc, Mip);
        const Uint32             MipWidth  = MipProps.StorageWidth;
        const Uint32             MipHeight = MipProps.StorageHeight;
        const Uint32             MipDepth  = MipProps.Depth;

        // When the size of a texture mipmap level is at least one standard tile shape for its
        // format, the mipmap level is guaranteed to be nonpacked.
        const bool IsUnpacked =
            MipWidth >= Props.TileSize[0] &&
            MipHeight >= Props.TileSize[1] &&
            MipDepth >= Props.TileSize[2];

        if (!IsUnpacked)
        {
            // Mip tail
            if (Props.FirstMipInTail == ~0u)
            {
                Props.FirstMipInTail = Mip;
                Props.MipTailOffset  = SliceSize;
            }
            Props.MipTailSize += MipProps.MipSize;
        }
        else
        {
            const uint3 NumTilesInMip = GetNumSparseTilesInBox(Box{0, MipWidth, 0, MipHeight, 0, MipDepth}, Props.TileSize);
            SliceSize += Uint64{NumTilesInMip.x} * NumTilesInMip.y * NumTilesInMip.z * SparseBlockSize;
        }
    }

    Props.FirstMipInTail   = std::min(Props.FirstMipInTail, TexDesc.MipLevels);
    Props.MipTailSize      = AlignUp(Props.MipTailSize, SparseBlockSize);
    SliceSize              = SliceSize + Props.MipTailSize;
    Props.MipTailStride    = TexDesc.IsArray() ? SliceSize : 0;
    Props.AddressSpaceSize = SliceSize * TexDesc.GetArraySize();
    Props.BlockSize        = SparseBlockSize;
    Props.Flags            = SPARSE_TEXTURE_FLAG_NONE;

    VERIFY_EXPR(Props.MipTailSize % SparseBlockSize == 0);
    VERIFY_EXPR(Props.MipTailStride % SparseBlockSize == 0);
    VERIFY_EXPR(Props.AddressSpaceSize % SparseBlockSize == 0);

    return Props;
}